

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O0

void __thiscall kj::anon_unknown_77::AsyncPipe::BlockedPumpFrom::abortRead(BlockedPumpFrom *this)

{
  anon_class_8_1_8991fb9c local_38;
  Promise<void> local_30;
  ArrayPtr<const_char> local_20;
  BlockedPumpFrom *local_10;
  BlockedPumpFrom *this_local;
  
  local_10 = this;
  StringPtr::StringPtr((StringPtr *)&local_20,"abortRead() was called");
  Canceler::cancel(&this->canceler,(StringPtr)local_20);
  local_38.this = this;
  evalNow<kj::(anonymous_namespace)::AsyncPipe::BlockedPumpFrom::abortRead()::_lambda()_1_>
            ((kj *)&local_30,&local_38);
  Promise<void>::operator=(&this->checkEofTask,&local_30);
  Promise<void>::~Promise(&local_30);
  endState(this->pipe,&this->super_AsyncIoStream);
  AsyncPipe::abortRead(this->pipe);
  return;
}

Assistant:

void abortRead() override {
      canceler.cancel("abortRead() was called");

      // The input might have reached EOF, but we haven't detected it yet because we haven't tried
      // to read that far. If we had not optimized tryPumpFrom() and instead used the default
      // pumpTo() implementation, then the input would not have called write() again once it
      // reached EOF, and therefore the abortRead() on the other end would *not* propagate an
      // exception! We need the same behavior here. To that end, we need to detect if we're at EOF
      // by reading one last byte.
      checkEofTask = kj::evalNow([&]() {
        static char junk;
        return input.tryRead(&junk, 1, 1).then([this](uint64_t n) {
          if (n == 0) {
            fulfiller.fulfill(kj::cp(pumpedSoFar));
          } else {
            fulfiller.reject(KJ_EXCEPTION(DISCONNECTED, "read end of pipe was aborted"));
          }
        }).eagerlyEvaluate([this](kj::Exception&& e) {
          fulfiller.reject(kj::mv(e));
        });
      });

      pipe.endState(*this);
      pipe.abortRead();
    }